

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O1

NodeRef __thiscall
embree::avx::BVHNBuilderQuantizedVirtual<4>::
BVHNBuilderT<embree::avx::CreateLeafQuantized<4,_embree::QuadMi<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeafQuantized<4,_embree::QuadMi<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  float fVar3;
  float fVar4;
  ThreadLocal *pTVar5;
  ThreadLocal2 *this_00;
  iterator __position;
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  __pointer_type pFVar9;
  undefined4 uVar10;
  ulong uVar11;
  char *pcVar12;
  size_t sVar13;
  long lVar14;
  unsigned_long uVar15;
  ulong uVar16;
  PrimRef *pPVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 in_ZMM0 [64];
  vuint<4> geomID;
  vuint<4> v1;
  vuint<4> primID;
  vuint<4> v0;
  vuint<4> v2;
  undefined1 local_b8 [16];
  ulong local_a8;
  __pointer_type local_a0;
  ulong local_98;
  ulong uStack_90;
  undefined1 local_88 [16];
  ThreadLocal2 *local_78;
  undefined8 uStack_70;
  ulong local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar21 = in_ZMM0._0_16_;
  uVar15 = set->_begin;
  local_a8 = (set->_end - uVar15) + 3;
  local_60 = local_a8 >> 2;
  local_98 = local_60 * 0x60;
  local_a0 = alloc->alloc;
  pTVar5 = alloc->talloc1;
  this_00 = pTVar5->parent;
  if (local_a0 != (this_00->alloc)._M_b._M_p) {
    local_88[8] = 1;
    local_88._0_8_ = this_00;
    MutexSys::lock(&this_00->mutex);
    pFVar9 = local_a0;
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    if (local_a0 == (__pointer_type)0x0) {
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = local_a0->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = local_a0->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = local_a0;
    UNLOCK();
    local_b8[8] = 1;
    local_b8._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    auVar21 = (undefined1  [16])0x0;
    local_78 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pFVar9->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pFVar9->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&pFVar9->thread_local_allocators,__position,&local_78);
    }
    else {
      *__position._M_current = local_78;
      pppTVar2 = &(pFVar9->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_b8[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_b8._0_8_);
    }
    if (local_88[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_88._0_8_);
    }
  }
  pTVar5->bytesUsed = pTVar5->bytesUsed + local_98;
  sVar13 = pTVar5->cur;
  uVar16 = (ulong)(-(int)sVar13 & 0xf);
  uVar11 = sVar13 + local_98 + uVar16;
  pTVar5->cur = uVar11;
  if (pTVar5->end < uVar11) {
    pTVar5->cur = sVar13;
    if (pTVar5->allocBlockSize < local_98 << 2) {
      pcVar12 = (char *)FastAllocator::malloc(local_a0,(size_t)&local_98);
    }
    else {
      local_b8._0_8_ = pTVar5->allocBlockSize;
      pcVar12 = (char *)FastAllocator::malloc(local_a0,(size_t)local_b8);
      pTVar5->ptr = pcVar12;
      sVar13 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
      pTVar5->bytesWasted = sVar13;
      pTVar5->cur = 0;
      pTVar5->end = local_b8._0_8_;
      pTVar5->cur = local_98;
      if ((ulong)local_b8._0_8_ < local_98) {
        pTVar5->cur = 0;
        local_b8._0_8_ = pTVar5->allocBlockSize;
        pcVar12 = (char *)FastAllocator::malloc(local_a0,(size_t)local_b8);
        pTVar5->ptr = pcVar12;
        sVar13 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
        pTVar5->bytesWasted = sVar13;
        pTVar5->cur = 0;
        pTVar5->end = local_b8._0_8_;
        pTVar5->cur = local_98;
        if ((ulong)local_b8._0_8_ < local_98) {
          pTVar5->cur = 0;
          pcVar12 = (char *)0x0;
          goto LAB_013887ea;
        }
      }
      pTVar5->bytesWasted = sVar13;
    }
  }
  else {
    pTVar5->bytesWasted = pTVar5->bytesWasted + uVar16;
    pcVar12 = pTVar5->ptr + (uVar11 - local_98);
  }
LAB_013887ea:
  if (3 < local_a8) {
    lVar14 = 0;
    auVar21 = vpcmpeqd_avx(auVar21,auVar21);
    do {
      uVar11 = set->_end;
      pSVar6 = ((this->createLeafFunc).bvh)->scene;
      pPVar17 = prims + uVar15;
      local_78 = (ThreadLocal2 *)0x0;
      uStack_70 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      lVar18 = 0;
      local_b8 = auVar21;
      local_88 = auVar21;
      do {
        if (uVar15 < uVar11) {
          fVar3 = (pPVar17->lower).field_0.m128[3];
          *(float *)(local_b8 + lVar18) = fVar3;
          fVar4 = (pPVar17->upper).field_0.m128[3];
          *(float *)(local_88 + lVar18) = fVar4;
          pGVar7 = (pSVar6->geometries).items[(uint)fVar3].ptr;
          lVar20 = (ulong)(uint)fVar4 *
                   pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar8 = *(long *)&pGVar7->field_0x58;
          uVar19 = *(uint *)&pGVar7[1].intersectionFilterN >> 2;
          *(uint *)((long)&local_78 + lVar18) = *(int *)(lVar8 + lVar20) * uVar19;
          *(uint *)((long)&local_98 + lVar18) = *(int *)(lVar8 + 4 + lVar20) * uVar19;
          *(uint *)((long)&local_48 + lVar18) = *(int *)(lVar8 + 8 + lVar20) * uVar19;
          *(uint *)((long)&local_58 + lVar18) = uVar19 * *(int *)(lVar8 + 0xc + lVar20);
          uVar15 = uVar15 + 1;
        }
        else if (lVar18 != 0) {
          *(undefined4 *)(local_b8 + lVar18) = local_b8._0_4_;
          *(undefined4 *)(local_88 + lVar18) = 0xffffffff;
          uVar10 = local_78._0_4_;
          *(undefined4 *)((long)&local_78 + lVar18) = local_78._0_4_;
          *(undefined4 *)((long)&local_98 + lVar18) = uVar10;
          *(undefined4 *)((long)&local_48 + lVar18) = uVar10;
          *(undefined4 *)((long)&local_58 + lVar18) = uVar10;
        }
        if (uVar15 < uVar11) {
          pPVar17 = prims + uVar15;
        }
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x10);
      lVar18 = lVar14 * 0x60;
      *(ThreadLocal2 **)(pcVar12 + lVar18) = local_78;
      *(undefined8 *)(pcVar12 + lVar18 + 8) = uStack_70;
      *(ulong *)(pcVar12 + lVar18 + 0x10) = local_98;
      *(ulong *)((long)(pcVar12 + lVar18 + 0x10) + 8) = uStack_90;
      *(undefined8 *)(pcVar12 + lVar18 + 0x20) = local_48;
      *(undefined8 *)(pcVar12 + lVar18 + 0x20 + 8) = uStack_40;
      *(undefined8 *)(pcVar12 + lVar18 + 0x30) = local_58;
      *(undefined8 *)(pcVar12 + lVar18 + 0x30 + 8) = uStack_50;
      *(undefined8 *)(pcVar12 + lVar18 + 0x40) = local_b8._0_8_;
      *(undefined8 *)(pcVar12 + lVar18 + 0x40 + 8) = local_b8._8_8_;
      *(undefined8 *)(pcVar12 + lVar18 + 0x50) = local_88._0_8_;
      *(undefined8 *)(pcVar12 + lVar18 + 0x50 + 8) = local_88._8_8_;
      lVar14 = lVar14 + 1;
    } while (lVar14 != local_60 + (local_60 == 0));
  }
  uVar11 = 7;
  if (local_60 < 7) {
    uVar11 = local_60;
  }
  return (NodeRef)(uVar11 | (ulong)pcVar12 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }